

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTreeIndex::prepareBoundingRectChange
          (QGraphicsSceneBspTreeIndex *this,QGraphicsItem *item)

{
  QGraphicsItemPrivate *pQVar1;
  int i;
  ulong uVar2;
  
  if (((item != (QGraphicsItem *)0x0) && (pQVar1 = (item->d_ptr).d, pQVar1->index != -1)) &&
     ((*(uint *)&pQVar1->field_0x161 & 0x20001600) == 0)) {
    QGraphicsSceneBspTreeIndexPrivate::removeItem
              (*(QGraphicsSceneBspTreeIndexPrivate **)(this + 8),item,false,true);
    for (uVar2 = 0; pQVar1 = (item->d_ptr).d, uVar2 < (ulong)(pQVar1->children).d.size;
        uVar2 = uVar2 + 1) {
      (**(code **)(*(long *)this + 0xd0))(this,(pQVar1->children).d.ptr[uVar2]);
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndex::prepareBoundingRectChange(const QGraphicsItem *item)
{
    if (!item)
        return;

    if (item->d_ptr->index == -1 || item->d_ptr->itemIsUntransformable()
        || (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
            || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)) {
        return; // Item is not in BSP tree; nothing to do.
    }

    Q_D(QGraphicsSceneBspTreeIndex);
    QGraphicsItem *thatItem = const_cast<QGraphicsItem *>(item);
    d->removeItem(thatItem, /*recursive=*/false, /*moveToUnindexedItems=*/true);
    for (int i = 0; i < item->d_ptr->children.size(); ++i)  // ### Do we really need this?
        prepareBoundingRectChange(item->d_ptr->children.at(i));
}